

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hack.c
# Opt level: O2

int still_chewing(xchar x,xchar y)

{
  undefined1 *puVar1;
  char cVar2;
  uint uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  level *plVar6;
  boolean bVar7;
  schar sVar8;
  int iVar9;
  uint uVar10;
  obj *poVar11;
  char *pcVar12;
  int iVar13;
  undefined7 in_register_00000031;
  char *pcVar14;
  int x_00;
  undefined7 in_register_00000039;
  
  plVar6 = level;
  x_00 = (int)CONCAT71(in_register_00000039,x);
  iVar13 = (int)CONCAT71(in_register_00000031,y);
  poVar11 = sobj_at(0x214,level,x_00,iVar13);
  if (digging.down != '\0') {
    digging.effort = 0;
    digging.lastdigtime = 0;
    digging.level.dnum = '\0';
    digging.level.dlevel = '\0';
    digging.pos.x = '\0';
    digging.pos.y = '\0';
    digging.down = '\0';
    digging.chew = '\0';
    digging.warned = '\0';
    digging.quiet = '\0';
  }
  if (((poVar11 == (obj *)0x0) && (plVar6->locations[x_00][iVar13].typ < '\x11')) &&
     (bVar7 = may_dig(level,x,y), bVar7 == '\0')) {
    pline("You hurt your teeth on the %s.");
    nomul(0,(char *)0x0);
  }
  else {
    if (((digging.pos.x == x) && (digging.pos.y == y)) &&
       (bVar7 = on_level(&digging.level,&u.uz), bVar7 != '\0')) {
      iVar9 = u.udaminc + digging.effort + 0x1e;
      digging.effort = iVar9;
      if (100 < iVar9) {
        violated(5);
        iVar9 = rnd(0x14);
        u.uhunger = u.uhunger + iVar9;
        if (poVar11 == (obj *)0x0) {
          cVar2 = plVar6->locations[x_00][iVar13].typ;
          if (cVar2 < '\r' && cVar2 != '\0') {
            pcVar14 = in_rooms(level,x,y,0x12);
            if (*pcVar14 == '\0') {
              pcVar12 = (char *)0x0;
            }
            else {
              sVar8 = acurrstr();
              add_damage(x,y,(long)sVar8 * 10);
              pcVar12 = "damage";
            }
            uVar3 = *(uint *)&(level->flags).field_0x8;
            if ((uVar3 >> 0x11 & 1) == 0) {
              if (((uVar3 >> 0x13 & 1) == 0) || (bVar7 = in_town(x_00,iVar13), bVar7 != '\0')) {
                plVar6->locations[x_00][iVar13].typ = '\x17';
                puVar1 = &plVar6->locations[x_00][iVar13].field_0x6;
                *(uint *)puVar1 = *(uint *)puVar1 & 0xfffffe0f;
              }
              else {
                plVar6->locations[x_00][iVar13].typ = '\x18';
              }
            }
            else {
              plVar6->locations[x_00][iVar13].typ = '\x19';
            }
            pcVar14 = "You chew a hole in the wall.";
            goto LAB_0019e8b2;
          }
          if ((cVar2 == '\r') ||
             ((cVar2 == '\0' && ((*(uint *)&(level->flags).field_0x8 & 0x100000) != 0)))) {
            plVar6->locations[x_00][iVar13].typ = '\x19';
            pcVar14 = "You chew through the tree.";
          }
          else if (cVar2 == '\x0f') {
            uVar3 = *(uint *)&plVar6->locations[x_00][iVar13].field_0x6;
            uVar10 = uVar3 & 0xfffffe0f;
            if ((uVar3 >> 8 & 1) == 0) {
              *(uint *)&plVar6->locations[x_00][iVar13].field_0x6 = uVar10 | 0x10;
              pcVar14 = "You chew through the secret door.";
            }
            else {
              *(uint *)&plVar6->locations[x_00][iVar13].field_0x6 = uVar10;
              pcVar14 = (char *)0x0;
              b_trapped("secret door",0);
            }
            plVar6->locations[x_00][iVar13].typ = '\x17';
          }
          else {
            if (cVar2 == '\x17') {
              pcVar14 = in_rooms(level,x,y,0x12);
              if (*pcVar14 == '\0') {
                pcVar12 = (char *)0x0;
              }
              else {
                add_damage(x,y,400);
                pcVar12 = "break";
              }
              uVar3 = *(uint *)&plVar6->locations[x_00][iVar13].field_0x6;
              uVar10 = uVar3 & 0xfffffe0f;
              if ((uVar3 >> 8 & 1) == 0) {
                *(uint *)&plVar6->locations[x_00][iVar13].field_0x6 = uVar10 | 0x10;
                pcVar14 = "You chew through the door.";
              }
              else {
                *(uint *)&plVar6->locations[x_00][iVar13].field_0x6 = uVar10;
                pcVar14 = (char *)0x0;
                b_trapped("door",0);
              }
              goto LAB_0019e8b2;
            }
            if (cVar2 == '\x16') {
              dissolve_bars(x_00,iVar13);
              pcVar14 = "You chew through the iron bars.";
              if (u.uz.dnum == dungeon_topology.d_sokoban_dnum) {
                sokoban_trickster();
              }
            }
            else {
              plVar6->locations[x_00][iVar13].typ = '\x18';
              pcVar14 = "You chew a passage through the rock.";
            }
          }
        }
        else {
          delobj(poVar11);
          pline("You eat the boulder.");
          if (((plVar6->locations[x_00][iVar13].typ < '\x11') ||
              (bVar7 = closed_door(level,x_00,iVar13), bVar7 != '\0')) ||
             (poVar11 = sobj_at(0x214,level,x_00,iVar13), poVar11 != (obj *)0x0)) {
            block_point(x_00,iVar13);
            digging.effort = 0;
            digging.lastdigtime = 0;
            digging.level.dnum = '\0';
            digging.level.dlevel = '\0';
            digging.pos.x = '\0';
            digging.pos.y = '\0';
            digging.down = '\0';
            digging.chew = '\0';
            digging.warned = '\0';
            digging.quiet = '\0';
            return 1;
          }
          pcVar14 = (char *)0x0;
        }
        pcVar12 = (char *)0x0;
LAB_0019e8b2:
        unblock_point(x_00,iVar13);
        newsym(x_00,iVar13);
        if (pcVar14 != (char *)0x0) {
          pline(pcVar14);
        }
        if (pcVar12 != (char *)0x0) {
          pay_for_damage(pcVar12,'\0');
        }
        digging.effort = 0;
        digging.lastdigtime = 0;
        digging.level.dnum = '\0';
        digging.level.dlevel = '\0';
        digging.pos.x = '\0';
        digging.pos.y = '\0';
        digging.down = '\0';
        digging.chew = '\0';
        digging.warned = '\0';
        digging.quiet = '\0';
        return 0;
      }
      if (flags.verbose != '\0') {
        pcVar14 = "continue";
        if (digging.chew == '\0') {
          pcVar14 = "begin";
        }
        if (poVar11 == (obj *)0x0) {
          cVar2 = plVar6->locations[x_00][iVar13].typ;
          if (cVar2 == '\r') {
            pcVar12 = "tree";
          }
          else if (cVar2 == '\x16') {
            pcVar12 = "bars";
          }
          else {
            pcVar12 = "tree";
            if (((cVar2 != '\x0e') &&
                ((cVar2 == '\0' & ((level->flags).field_0xa & 0x10) >> 4) == 0)) &&
               (pcVar12 = "door", cVar2 < '\x11')) {
              pcVar12 = "rock";
            }
          }
        }
        else {
          pcVar12 = "boulder";
        }
        pline("You %s chewing on the %s.",pcVar14,pcVar12);
      }
      digging.chew = '\x01';
    }
    else {
      uVar4 = digging._8_8_;
      digging.level.dnum = '\0';
      digging.level.dlevel = '\0';
      digging.pos.x = '\0';
      digging.pos.y = '\0';
      digging.down = '\0';
      digging.chew = '\x01';
      digging.warned = '\0';
      uVar5 = digging._8_8_;
      digging.level = SUB82(uVar4,0);
      digging.pos.x = x;
      digging._12_4_ = SUB84(uVar5,4);
      digging.pos.y = y;
      assign_level(&digging.level,&u.uz);
      cVar2 = plVar6->locations[x_00][iVar13].typ;
      iVar13 = 0x3c;
      if (((cVar2 != '\r' && cVar2 < '\x11') &&
          ((cVar2 != '\0' || ((*(uint *)&(level->flags).field_0x8 & 0x100000) == 0)))) &&
         (iVar13 = 0x1e, cVar2 == '\x0e')) {
        iVar13 = 0x3c;
      }
      digging.effort = u.udaminc + iVar13;
      if (poVar11 == (obj *)0x0) {
        if (cVar2 == '\r') {
          pcVar14 = "on a tree";
        }
        else if (cVar2 == '\x16') {
          pcVar14 = "on the iron bars";
        }
        else {
          pcVar14 = "on a tree";
          if (((cVar2 != '\x0e') && ((cVar2 == '\0' & ((level->flags).field_0xa & 0x10) >> 4) == 0))
             && (pcVar14 = "a hole in the door", cVar2 < '\x11')) {
            pcVar14 = "a hole in the rock";
          }
        }
      }
      else {
        pcVar14 = "on a boulder";
      }
      pline("You start chewing %s.",pcVar14);
    }
    watch_dig((monst *)0x0,x,y,'\0');
  }
  return 1;
}

Assistant:

static int still_chewing(xchar x, xchar y)
{
    struct rm *loc = &level->locations[x][y];
    struct obj *boulder = sobj_at(BOULDER, level, x,y);
    const char *digtxt = NULL, *dmgtxt = NULL;

    if (digging.down)		/* not continuing previous dig (w/ pick-axe) */
	memset(&digging, 0, sizeof digging);

    if (!boulder && IS_ROCK(loc->typ) && !may_dig(level, x,y)) {
	pline("You hurt your teeth on the %s.",
	      IS_TREES(level, loc->typ) ? "tree" : "hard stone");
	nomul(0, NULL);
	return 1;
    } else if (digging.pos.x != x || digging.pos.y != y ||
		!on_level(&digging.level, &u.uz)) {
	digging.down = FALSE;
	digging.chew = TRUE;
	digging.warned = FALSE;
	digging.pos.x = x;
	digging.pos.y = y;
	assign_level(&digging.level, &u.uz);
	/* solid rock takes more work & time to dig through */
	digging.effort = (IS_ROCK(loc->typ) && !IS_TREES(level, loc->typ) ?
			  30 : 60) + u.udaminc;
	pline("You start chewing %s.",
	      boulder ? "on a boulder" :
	      loc->typ == IRONBARS ? "on the iron bars" :
	      IS_TREES(level, loc->typ) ? "on a tree" :
	      IS_ROCK(loc->typ) ? "a hole in the rock" :
	      "a hole in the door");
	watch_dig(NULL, x, y, FALSE);
	return 1;
    } else if ((digging.effort += (30 + u.udaminc)) <= 100)  {
	if (flags.verbose)
	    pline("You %s chewing on the %s.",
		digging.chew ? "continue" : "begin",
		boulder ? "boulder" :
		loc->typ == IRONBARS ? "bars" :
		IS_TREES(level, loc->typ) ? "tree" :
		IS_ROCK(loc->typ) ? "rock" : "door");
	digging.chew = TRUE;
	watch_dig(NULL, x, y, FALSE);
	return 1;
    }

    /* Okay, you've chewed through something */
    violated(CONDUCT_FOODLESS);
    u.uhunger += rnd(20);

    if (boulder) {
	delobj(boulder);		/* boulder goes bye-bye */
	pline("You eat the boulder.");	/* yum */

	/*
	 *  The location could still block because of
	 *	1. More than one boulder
	 *	2. Boulder stuck in a wall/stone/door.
	 *
	 *  [perhaps use does_block() below (from vision.c)]
	 */
	if (IS_ROCK(loc->typ) || closed_door(level, x,y) || sobj_at(BOULDER, level, x,y)) {
	    block_point(x,y);	/* delobj will unblock the point */
	    /* reset dig state */
	    memset(&digging, 0, sizeof digging);
	    return 1;
	}

    } else if (IS_WALL(loc->typ)) {
	if (*in_rooms(level, x, y, SHOPBASE)) {
	    add_damage(x, y, 10L * ACURRSTR);
	    dmgtxt = "damage";
	}
	digtxt = "You chew a hole in the wall.";
	if (level->flags.is_maze_lev) {
	    loc->typ = ROOM;
	} else if (level->flags.is_cavernous_lev && !in_town(x, y)) {
	    loc->typ = CORR;
	} else {
	    loc->typ = DOOR;
	    loc->doormask = D_NODOOR;
	}
    } else if (IS_TREE(level, loc->typ)) {
	digtxt = "You chew through the tree.";
	loc->typ = ROOM;
    } else if (loc->typ == IRONBARS) {
	digtxt = "You chew through the iron bars.";
	dissolve_bars(x, y);
	if (In_sokoban(&u.uz))
	    sokoban_trickster();
    } else if (loc->typ == SDOOR) {
	if (loc->doormask & D_TRAPPED) {
	    loc->doormask = D_NODOOR;
	    b_trapped("secret door", 0);
	} else {
	    digtxt = "You chew through the secret door.";
	    loc->doormask = D_BROKEN;
	}
	loc->typ = DOOR;

    } else if (IS_DOOR(loc->typ)) {
	if (*in_rooms(level, x, y, SHOPBASE)) {
	    add_damage(x, y, 400L);
	    dmgtxt = "break";
	}
	if (loc->doormask & D_TRAPPED) {
	    loc->doormask = D_NODOOR;
	    b_trapped("door", 0);
	} else {
	    digtxt = "You chew through the door.";
	    loc->doormask = D_BROKEN;
	}

    } else { /* STONE or SCORR */
	digtxt = "You chew a passage through the rock.";
	loc->typ = CORR;
    }

    unblock_point(x, y);	/* vision */
    newsym(x, y);
    if (digtxt) pline(digtxt);	/* after newsym */
    if (dmgtxt) pay_for_damage(dmgtxt, FALSE);
    memset(&digging, 0, sizeof digging);
    return 0;
}